

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::Function::WhileEachInst
          (Function *this,function<bool_(const_spvtools::opt::Instruction_*)> *f,
          bool run_on_debug_line_insts,bool run_on_non_semantic_insts)

{
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> _Var1;
  _Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  _Var2;
  Instruction *pIVar3;
  pointer puVar4;
  bool bVar5;
  bool bVar6;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  Instruction *dbg_line;
  Instruction *pIVar7;
  pointer puVar8;
  Instruction *pIVar9;
  Instruction *dbg_line_1;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  *non_semantic;
  pointer puVar10;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> *param;
  bool bVar11;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_58;
  undefined4 local_4c;
  Function *local_48;
  Instruction *local_40;
  undefined4 local_34;
  
  local_34 = (undefined4)CONCAT71(in_register_00000009,run_on_non_semantic_insts);
  local_4c = (undefined4)CONCAT71(in_register_00000011,run_on_debug_line_insts);
  _Var1._M_head_impl =
       (this->def_inst_)._M_t.
       super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
       ._M_t.
       super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
       .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  local_48 = this;
  if (_Var1._M_head_impl == (Instruction *)0x0) {
LAB_0021aef2:
    pIVar7 = (Instruction *)
             (local_48->params_).
             super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_40 = (Instruction *)
               (local_48->params_).
               super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    bVar11 = pIVar7 == local_40;
    while (!bVar11) {
      _Var2.super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
           (((__uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
              *)&(pIVar7->super_IntrusiveNodeBase<spvtools::opt::Instruction>).
                 _vptr_IntrusiveNodeBase)->_M_t).
           super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
           .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>;
      if ((char)local_4c != '\0') {
        pIVar9 = *(Instruction **)
                  ((long)_Var2.super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                         _M_head_impl + 0x50);
        pIVar3 = *(Instruction **)
                  ((long)_Var2.super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                         _M_head_impl + 0x58);
        if (pIVar9 != pIVar3) {
          bVar5 = false;
          do {
            local_58._M_head_impl = pIVar9;
            if ((f->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_0021b1ec;
            bVar6 = (*f->_M_invoker)((_Any_data *)f,&local_58._M_head_impl);
            if (!bVar6) {
              if (!bVar5) goto LAB_0021af92;
              break;
            }
            pIVar9 = pIVar9 + 1;
            bVar5 = pIVar9 == pIVar3;
          } while (!bVar5);
        }
      }
      local_58 = _Var2.super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
      if ((f->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_0021b1ec;
      bVar5 = (*f->_M_invoker)((_Any_data *)f,&local_58._M_head_impl);
      if (!bVar5) {
LAB_0021af92:
        if (!bVar11) goto LAB_0021b1db;
        break;
      }
      pIVar7 = (Instruction *)
               &(pIVar7->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
      bVar11 = pIVar7 == local_40;
    }
    local_40 = &(local_48->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.
                sentinel_;
    pIVar7 = (local_48->debug_insts_in_header_).super_IntrusiveList<spvtools::opt::Instruction>.
             sentinel_.super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
    bVar11 = pIVar7 == local_40;
    if (!bVar11) {
      do {
        if ((char)local_4c != '\0') {
          pIVar9 = (pIVar7->dbg_line_insts_).
                   super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pIVar3 = (pIVar7->dbg_line_insts_).
                   super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (pIVar9 != pIVar3) {
            bVar5 = false;
            do {
              local_58._M_head_impl = pIVar9;
              if ((f->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_0021b1ec;
              bVar6 = (*f->_M_invoker)((_Any_data *)f,&local_58._M_head_impl);
              if (!bVar6) {
                if (!bVar5) goto LAB_0021b03c;
                break;
              }
              pIVar9 = pIVar9 + 1;
              bVar5 = pIVar9 == pIVar3;
            } while (!bVar5);
          }
        }
        local_58._M_head_impl = pIVar7;
        if ((f->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_0021b1ec;
        bVar5 = (*f->_M_invoker)((_Any_data *)f,&local_58._M_head_impl);
        if (!bVar5) {
LAB_0021b03c:
          if (!bVar11) goto LAB_0021b1db;
          break;
        }
        pIVar7 = (pIVar7->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
        bVar11 = pIVar7 == local_40;
      } while (!bVar11);
    }
    puVar8 = (local_48->blocks_).
             super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar4 = (local_48->blocks_).
             super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar11 = puVar8 == puVar4;
    if (!bVar11) {
      bVar5 = (bool)(char)local_4c;
      bVar6 = BasicBlock::WhileEachInst
                        ((puVar8->_M_t).
                         super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                         .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl,f,
                         (bool)(char)local_4c);
      if (bVar6) {
        do {
          puVar8 = puVar8 + 1;
          bVar11 = puVar8 == puVar4;
          if (bVar11) goto LAB_0021b0a7;
          bVar6 = BasicBlock::WhileEachInst
                            ((puVar8->_M_t).
                             super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
                             .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl
                             ,f,bVar5);
        } while (bVar6);
      }
      if (!bVar11) goto LAB_0021b1db;
    }
LAB_0021b0a7:
    pIVar7 = (local_48->end_inst_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
             .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
    if (pIVar7 != (Instruction *)0x0) {
      if ((char)local_4c != '\0') {
        pIVar9 = (pIVar7->dbg_line_insts_).
                 super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pIVar3 = *(pointer *)
                  ((long)&(pIVar7->dbg_line_insts_).
                          super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                  + 8);
        if (pIVar9 != pIVar3) {
          bVar11 = false;
          do {
            local_58._M_head_impl = pIVar9;
            if ((f->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_0021b1ec;
            bVar5 = (*f->_M_invoker)((_Any_data *)f,&local_58._M_head_impl);
            if (!bVar5) {
              if (!bVar11) goto LAB_0021b1db;
              break;
            }
            pIVar9 = pIVar9 + 1;
            bVar11 = pIVar9 == pIVar3;
          } while (!bVar11);
        }
      }
      local_58._M_head_impl = pIVar7;
      if ((f->super__Function_base)._M_manager == (_Manager_type)0x0) {
LAB_0021b1ec:
        std::__throw_bad_function_call();
      }
      bVar11 = (*f->_M_invoker)((_Any_data *)f,&local_58._M_head_impl);
      if (!bVar11) goto LAB_0021b1db;
    }
    if ((char)local_34 != '\0') {
      puVar10 = (local_48->non_semantic_).
                super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_40 = (Instruction *)
                 (local_48->non_semantic_).
                 super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      bVar11 = (Instruction *)puVar10 == local_40;
      while (!bVar11) {
        pIVar7 = (puVar10->_M_t).
                 super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                 .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
        if ((char)local_4c != '\0') {
          pIVar9 = (pIVar7->dbg_line_insts_).
                   super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pIVar3 = *(pointer *)
                    ((long)&(pIVar7->dbg_line_insts_).
                            super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                    + 8);
          if (pIVar9 != pIVar3) {
            bVar5 = false;
            do {
              local_58._M_head_impl = pIVar9;
              if ((f->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_0021b1ec;
              bVar6 = (*f->_M_invoker)((_Any_data *)f,&local_58._M_head_impl);
              if (!bVar6) {
                if (!bVar5) goto LAB_0021b1d0;
                break;
              }
              pIVar9 = pIVar9 + 1;
              bVar5 = pIVar9 == pIVar3;
            } while (!bVar5);
          }
        }
        local_58._M_head_impl = pIVar7;
        if ((f->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_0021b1ec;
        bVar5 = (*f->_M_invoker)((_Any_data *)f,&local_58._M_head_impl);
        if (!bVar5) {
LAB_0021b1d0:
          if (!bVar11) goto LAB_0021b1db;
          break;
        }
        puVar10 = puVar10 + 1;
        bVar11 = (Instruction *)puVar10 == local_40;
      }
    }
    bVar11 = true;
  }
  else {
    if (run_on_debug_line_insts) {
      pIVar7 = *(Instruction **)
                &((_Var1._M_head_impl)->dbg_line_insts_).
                 super__Vector_base<spvtools::opt::Instruction,_std::allocator<spvtools::opt::Instruction>_>
                 ._M_impl;
      pIVar9 = *(pointer *)((long)&(_Var1._M_head_impl)->dbg_line_insts_ + 8);
      if (pIVar7 != pIVar9) {
        bVar11 = false;
        do {
          local_58._M_head_impl = pIVar7;
          if ((f->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_0021b1ec;
          bVar5 = (*f->_M_invoker)((_Any_data *)f,&local_58._M_head_impl);
          if (!bVar5) {
            if (!bVar11) goto LAB_0021b1db;
            break;
          }
          pIVar7 = pIVar7 + 1;
          bVar11 = pIVar7 == pIVar9;
        } while (!bVar11);
      }
    }
    local_58._M_head_impl = _Var1._M_head_impl;
    if ((f->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_0021b1ec;
    bVar11 = (*f->_M_invoker)((_Any_data *)f,&local_58._M_head_impl);
    if (bVar11) goto LAB_0021aef2;
LAB_0021b1db:
    bVar11 = false;
  }
  return bVar11;
}

Assistant:

bool Function::WhileEachInst(const std::function<bool(const Instruction*)>& f,
                             bool run_on_debug_line_insts,
                             bool run_on_non_semantic_insts) const {
  if (def_inst_) {
    if (!static_cast<const Instruction*>(def_inst_.get())
             ->WhileEachInst(f, run_on_debug_line_insts)) {
      return false;
    }
  }

  for (const auto& param : params_) {
    if (!static_cast<const Instruction*>(param.get())
             ->WhileEachInst(f, run_on_debug_line_insts)) {
      return false;
    }
  }

  for (const auto& di : debug_insts_in_header_) {
    if (!static_cast<const Instruction*>(&di)->WhileEachInst(
            f, run_on_debug_line_insts))
      return false;
  }

  for (const auto& bb : blocks_) {
    if (!static_cast<const BasicBlock*>(bb.get())->WhileEachInst(
            f, run_on_debug_line_insts)) {
      return false;
    }
  }

  if (end_inst_) {
    if (!static_cast<const Instruction*>(end_inst_.get())
             ->WhileEachInst(f, run_on_debug_line_insts)) {
      return false;
    }
  }

  if (run_on_non_semantic_insts) {
    for (auto& non_semantic : non_semantic_) {
      if (!static_cast<const Instruction*>(non_semantic.get())
               ->WhileEachInst(f, run_on_debug_line_insts)) {
        return false;
      }
    }
  }

  return true;
}